

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags,
                     ImGuiWindow *docked_window)

{
  ImVec2 *pIVar1;
  short sVar2;
  ImGuiWindow *pIVar3;
  bool bVar4;
  ImGuiContext *ctx;
  ImU32 tab_id;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  char *pcVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  ImVec2 IVar13;
  ImGuiID local_204;
  ImGuiCol local_200;
  ImGuiCol local_1fc;
  bool local_1f2;
  bool local_1f1;
  ImGuiDockNode *local_1f0;
  bool local_1e2;
  bool local_1e1;
  bool local_18e;
  bool local_18d;
  ImGuiID local_18c;
  bool text_clipped;
  bool just_closed;
  ImGuiID close_button_id;
  bool hovered_unblocked;
  ImDrawList *pIStack_180;
  ImU32 tab_col;
  ImDrawList *display_draw_list;
  float local_16c;
  float local_168;
  float distance_from_edge_y;
  float threshold_y;
  float threshold_x;
  float threshold_base;
  bool undocking_tab;
  float drag_distance_from_edge_x;
  bool single_floating_window_node;
  ImGuiDockNode *node;
  bool pressed;
  bool held;
  bool hovered;
  ImVec2 IStack_140;
  ImGuiButtonFlags button_flags;
  ImVec2 local_138;
  ImVec2 backup_cursor_max_pos;
  ImVec2 local_124;
  bool local_119;
  ImVec2 IStack_118;
  bool want_clip_rect;
  undefined1 local_110 [8];
  ImRect bb;
  ImVec2 pos;
  ImVec2 local_e4;
  ImVec2 local_dc;
  byte local_d1;
  ImVec2 IStack_d0;
  bool is_central_section;
  ImVec2 backup_main_cursor_pos;
  undefined1 local_b0 [3];
  bool tab_contents_visible;
  bool is_tab_button;
  bool tab_appearing;
  bool tab_bar_focused;
  bool tab_bar_appearing;
  byte local_79;
  ImGuiTabItem *pIStack_78;
  bool tab_is_new;
  ImGuiTabItem *tab;
  float fStack_68;
  ImVec2 size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindow *docked_window_local;
  bool *pbStack_28;
  ImGuiTabItemFlags flags_local;
  bool *p_open_local;
  char *label_local;
  ImGuiTabBar *tab_bar_local;
  
  if ((tab_bar->WantLayout & 1U) != 0) {
    TabBarLayout(tab_bar);
  }
  ctx = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if ((pIVar3->SkipItems & 1U) == 0) {
    tab_id = TabBarCalcTabID(tab_bar,label,docked_window);
    if ((p_open == (bool *)0x0) || ((*p_open & 1U) != 0)) {
      if (p_open != (bool *)0x0 && (flags & 0x200000U) != 0) {
        __assert_fail("!p_open || !(flags & ImGuiTabItemFlags_Button)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                      ,0x1da8,
                      "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                     );
      }
      if ((flags & 0xc0U) == 0xc0) {
        __assert_fail("(flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                      ,0x1da9,
                      "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                     );
      }
      docked_window_local._4_4_ = flags;
      if ((flags & 0x100000U) == 0) {
        pbStack_28 = p_open;
        if (p_open == (bool *)0x0) {
          docked_window_local._4_4_ = flags | 0x100000;
        }
      }
      else {
        pbStack_28 = (bool *)0x0;
      }
      register0x00001200 = TabItemCalcSize(label,pbStack_28 != (bool *)0x0);
      pIStack_78 = TabBarFindTabByID(tab_bar,tab_id);
      local_79 = 0;
      bVar9 = pIStack_78 == (ImGuiTabItem *)0x0;
      if (bVar9) {
        ImGuiTabItem::ImGuiTabItem((ImGuiTabItem *)local_b0);
        ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)local_b0);
        pIStack_78 = ImVector<ImGuiTabItem>::back(&tab_bar->Tabs);
        pIStack_78->ID = tab_id;
        pIStack_78->Width = tab._4_4_;
        tab_bar->TabsAddedNew = true;
      }
      local_79 = bVar9;
      iVar5 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIStack_78);
      tab_bar->LastTabItemIdx = (ImS16)iVar5;
      pIStack_78->ContentWidth = tab._4_4_;
      sVar2 = tab_bar->TabsActiveCount;
      tab_bar->TabsActiveCount = sVar2 + 1;
      pIStack_78->BeginOrder = sVar2;
      bVar9 = tab_bar->PrevFrameVisible + 1 < ctx->FrameCount;
      bVar10 = (tab_bar->Flags & 0x200000U) != 0;
      bVar4 = pIStack_78->LastFrameVisible + 1 < ctx->FrameCount;
      bVar11 = (docked_window_local._4_4_ & 0x200000) != 0;
      pIStack_78->LastFrameVisible = ctx->FrameCount;
      pIStack_78->Flags = docked_window_local._4_4_;
      pIStack_78->Window = docked_window;
      if (pIStack_78->Window == (ImGuiWindow *)0x0) {
        if (pIStack_78->Window != (ImGuiWindow *)0x0) {
          __assert_fail("tab->Window == __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                        ,0x1dd5,
                        "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                       );
        }
        iVar5 = ImGuiTextBuffer::size(&tab_bar->TabsNames);
        pIStack_78->NameOffset = (ImS16)iVar5;
        sVar7 = strlen(label);
        ImGuiTextBuffer::append(&tab_bar->TabsNames,label,label + sVar7 + 1);
      }
      else {
        if ((tab_bar->Flags & 0x100000U) == 0) {
          __assert_fail("tab_bar->Flags & ImGuiTabBarFlags_DockNode",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                        ,0x1dd0,
                        "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                       );
        }
        pIStack_78->NameOffset = -1;
      }
      if ((((bVar4) && ((tab_bar->Flags & 2U) != 0)) && (tab_bar->NextSelectedTabId == 0)) &&
         (((!bVar9 || (tab_bar->SelectedTabId == 0)) && (!bVar11)))) {
        tab_bar->NextSelectedTabId = tab_id;
      }
      if ((((docked_window_local._4_4_ & 2) != 0) && (tab_bar->SelectedTabId != tab_id)) &&
         (!bVar11)) {
        tab_bar->NextSelectedTabId = tab_id;
      }
      tab_bar_local._7_1_ = tab_bar->VisibleTabId == tab_id;
      if (tab_bar_local._7_1_) {
        tab_bar->VisibleTabWasSubmitted = true;
      }
      else if ((((tab_bar->SelectedTabId == 0) && (bVar9)) && (docked_window == (ImGuiWindow *)0x0))
              && (((tab_bar->Tabs).Size == 1 && ((tab_bar->Flags & 2U) == 0)))) {
        tab_bar_local._7_1_ = true;
      }
      if ((!bVar4) || ((bVar9 && ((local_79 & 1) == 0)))) {
        if (tab_bar->SelectedTabId == tab_id) {
          pIStack_78->LastFrameSelected = ctx->FrameCount;
        }
        IStack_d0 = (pIVar3->DC).CursorPos;
        local_d1 = (pIStack_78->Flags & 0xc0U) == 0;
        stack0xffffffffffffff94 = (ImVec2)CONCAT44(fStack_68,pIStack_78->Width);
        if ((bool)local_d1) {
          ImVec2::ImVec2(&local_e4,(float)(int)(pIStack_78->Offset - tab_bar->ScrollingAnim),0.0);
          local_dc = operator+(&(tab_bar->BarRect).Min,&local_e4);
          (pIVar3->DC).CursorPos = local_dc;
        }
        else {
          ImVec2::ImVec2((ImVec2 *)&pos.y,pIStack_78->Offset,0.0);
          IVar13 = operator+(&(tab_bar->BarRect).Min,(ImVec2 *)&pos.y);
          (pIVar3->DC).CursorPos = IVar13;
        }
        bb.Max = (pIVar3->DC).CursorPos;
        IStack_118 = operator+(&bb.Max,(ImVec2 *)((long)&tab + 4));
        ImRect::ImRect((ImRect *)local_110,&bb.Max,&stack0xfffffffffffffee8);
        local_1e1 = false;
        if ((local_d1 & 1) != 0) {
          local_1e2 = true;
          if (tab_bar->ScrollingRectMinX <= (float)local_110._0_4_) {
            local_1e2 = tab_bar->ScrollingRectMaxX <= bb.Min.x &&
                        bb.Min.x != tab_bar->ScrollingRectMaxX;
          }
          local_1e1 = local_1e2;
        }
        local_119 = local_1e1;
        if (local_1e1 != false) {
          fVar12 = ImMax<float>((float)local_110._0_4_,tab_bar->ScrollingRectMinX);
          ImVec2::ImVec2(&local_124,fVar12,(float)local_110._4_4_ - 1.0);
          ImVec2::ImVec2((ImVec2 *)&backup_cursor_max_pos.y,tab_bar->ScrollingRectMaxX,bb.Min.y);
          PushClipRect(&local_124,(ImVec2 *)&backup_cursor_max_pos.y,true);
        }
        local_138 = (pIVar3->DC).CursorMaxPos;
        IStack_140 = ImRect::GetSize((ImRect *)local_110);
        ItemSize(&stack0xfffffffffffffec0,(ctx->Style).FramePadding.y);
        (pIVar3->DC).CursorMaxPos = local_138;
        bVar9 = ItemAdd((ImRect *)local_110,tab_id,(ImRect *)0x0);
        if (bVar9) {
          uVar6 = 0x10;
          if (bVar11) {
            uVar6 = 0x20;
          }
          node._4_4_ = uVar6 | 0x1000;
          if (((ctx->DragDropActive & 1U) != 0) &&
             (bVar9 = ImGuiPayload::IsDataType(&ctx->DragDropPayload,"_IMWINDOW"), !bVar9)) {
            node._4_4_ = node._4_4_ | 0x200;
          }
          node._1_1_ = ButtonBehavior((ImRect *)local_110,tab_id,(bool *)((long)&node + 3),
                                      (bool *)((long)&node + 2),node._4_4_);
          if (((bool)node._1_1_) && (!bVar11)) {
            tab_bar->NextSelectedTabId = tab_id;
          }
          node._3_1_ = (node._3_1_ & 1) != 0 || ctx->HoveredId == tab_id;
          if (((((node._2_1_ & 1) != 0) && (docked_window != (ImGuiWindow *)0x0)) &&
              (ctx->ActiveId == tab_id)) && ((ctx->ActiveIdIsJustActivated & 1U) != 0)) {
            ctx->ActiveIdWindow = docked_window;
          }
          if ((node._2_1_ & 1) == 0) {
            SetItemAllowOverlap();
          }
          if (docked_window == (ImGuiWindow *)0x0) {
            local_1f0 = (ImGuiDockNode *)0x0;
          }
          else {
            local_1f0 = docked_window->DockNode;
          }
          _drag_distance_from_edge_x = local_1f0;
          local_1f1 = false;
          if (local_1f0 != (ImGuiDockNode *)0x0) {
            bVar9 = ImGuiDockNode::IsFloatingNode(local_1f0);
            local_1f1 = false;
            if (bVar9) {
              local_1f1 = (_drag_distance_from_edge_x->Windows).Size == 1;
            }
          }
          undocking_tab = local_1f1;
          if ((((node._2_1_ & 1) == 0) || (local_1f1 == false)) ||
             (bVar9 = IsMouseDragging(0,0.0), !bVar9)) {
            if ((((node._2_1_ & 1) != 0) && (!bVar4)) && (bVar9 = IsMouseDragging(0,-1.0), bVar9)) {
              threshold_base = 0.0;
              if (((ctx->DragDropActive & 1U) == 0) &&
                 (((tab_bar->Flags & 1U) != 0 || (docked_window != (ImGuiWindow *)0x0)))) {
                pIVar1 = &(ctx->IO).MouseDelta;
                if ((0.0 < pIVar1->x || pIVar1->x == 0.0) ||
                   ((float)local_110._0_4_ <= (ctx->IO).MousePos.x)) {
                  if (((0.0 < (ctx->IO).MouseDelta.x) && (bb.Min.x < (ctx->IO).MousePos.x)) &&
                     (threshold_base = (ctx->IO).MousePos.x - bb.Min.x, (tab_bar->Flags & 1U) != 0))
                  {
                    TabBarQueueReorder(tab_bar,pIStack_78,1);
                  }
                }
                else {
                  threshold_base = (float)local_110._0_4_ - (ctx->IO).MousePos.x;
                  if ((tab_bar->Flags & 1U) != 0) {
                    TabBarQueueReorder(tab_bar,pIStack_78,-1);
                  }
                }
              }
              if ((docked_window != (ImGuiWindow *)0x0) && ((docked_window->Flags & 4U) == 0)) {
                local_1f2 = false;
                if ((ctx->DragDropActive & 1U) != 0) {
                  local_1f2 = (ctx->DragDropPayload).SourceId == tab_id;
                }
                threshold_x._3_1_ = local_1f2;
                if (local_1f2 == false) {
                  fVar12 = ctx->FontSize;
                  distance_from_edge_y = fVar12 * 2.2;
                  threshold_y = fVar12;
                  local_168 = ImClamp<float>((-fVar12 + -fVar12 +
                                             ABS((ctx->IO).MouseDragMaxDistanceAbs[0].x)) * 0.2,0.0,
                                             fVar12 * 4.0);
                  local_168 = fVar12 * 1.5 + local_168;
                  local_16c = ImMax<float>((float)local_110._4_4_ - (ctx->IO).MousePos.y,
                                           (ctx->IO).MousePos.y - bb.Min.y);
                  if (local_16c < local_168) {
                    if ((distance_from_edge_y < threshold_base) &&
                       (((tab_bar->ReorderRequestDir < '\0' &&
                         (iVar5 = ImGuiTabBar::GetTabOrder(tab_bar,pIStack_78), iVar5 == 0)) ||
                        (('\0' < tab_bar->ReorderRequestDir &&
                         (iVar5 = ImGuiTabBar::GetTabOrder(tab_bar,pIStack_78),
                         iVar5 == (tab_bar->Tabs).Size + -1)))))) {
                      threshold_x._3_1_ = 1;
                    }
                  }
                  else {
                    threshold_x._3_1_ = 1;
                  }
                }
                if ((threshold_x._3_1_ & 1) != 0) {
                  DockContextQueueUndockWindow(ctx,docked_window);
                  ctx->MovingWindow = docked_window;
                  SetActiveID(ctx->MovingWindow->MoveId,ctx->MovingWindow);
                  register0x00001200 = operator-(&ctx->MovingWindow->Pos,(ImVec2 *)local_110);
                  operator-=(&ctx->ActiveIdClickOffset,(ImVec2 *)((long)&display_draw_list + 4));
                  ctx->ActiveIdNoClearOnFocusLoss = true;
                }
              }
            }
          }
          else {
            StartMouseMovingWindow(docked_window);
          }
          pIStack_180 = pIVar3->DrawList;
          if (((node._2_1_ & 1) == 0) && ((node._3_1_ & 1) == 0)) {
            if (tab_bar_local._7_1_ == false) {
              local_200 = 0x24;
              if (bVar10) {
                local_200 = 0x21;
              }
            }
            else {
              local_200 = 0x25;
              if (bVar10) {
                local_200 = 0x23;
              }
            }
            local_1fc = local_200;
          }
          else {
            local_1fc = 0x22;
          }
          close_button_id = GetColorU32(local_1fc,1.0);
          TabItemBackground(pIStack_180,(ImRect *)local_110,docked_window_local._4_4_,
                            close_button_id);
          RenderNavHighlight((ImRect *)local_110,tab_id,1);
          just_closed = IsItemHovered(8);
          if ((just_closed) &&
             (((bVar9 = IsMouseClicked(1,false), bVar9 || (bVar9 = IsMouseReleased(1), bVar9)) &&
              (!bVar11)))) {
            tab_bar->NextSelectedTabId = tab_id;
          }
          if ((tab_bar->Flags & 8U) != 0) {
            docked_window_local._4_4_ = docked_window_local._4_4_ | 4;
          }
          if (pbStack_28 == (bool *)0x0) {
            local_204 = 0;
          }
          else {
            local_204 = GetIDWithSeed("#CLOSE",(char *)0x0,tab_id);
          }
          local_18c = local_204;
          TabItemLabelAndCloseButton
                    (pIStack_180,(ImRect *)local_110,docked_window_local._4_4_,tab_bar->FramePadding
                     ,label,tab_id,local_204,tab_bar_local._7_1_,&local_18d,&local_18e);
          if (((local_18d & 1U) != 0) && (pbStack_28 != (bool *)0x0)) {
            *pbStack_28 = false;
            TabBarCloseTab(tab_bar,pIStack_78);
          }
          if ((local_119 & 1U) != 0) {
            PopClipRect();
          }
          (pIVar3->DC).CursorPos = IStack_d0;
          if ((((local_18e & 1U) != 0) && (ctx->HoveredId == tab_id)) &&
             (((node._2_1_ & 1) == 0 &&
              ((((0.5 < ctx->HoveredIdNotActiveTimer && (bVar9 = IsItemHovered(0), bVar9)) &&
                ((tab_bar->Flags & 0x20U) == 0)) && ((pIStack_78->Flags & 0x10U) == 0)))))) {
            pcVar8 = FindRenderedTextEnd(label,(char *)0x0);
            SetTooltip("%.*s",(ulong)(uint)((int)pcVar8 - (int)label),label);
          }
          bVar9 = true;
          if (bVar11) {
            bVar9 = tab_bar->SelectedTabId != pIStack_78->ID || !bVar11;
          }
          if (!bVar9) {
            __assert_fail("!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                          ,0x1e9c,
                          "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                         );
          }
          if (bVar11) {
            tab_bar_local._7_1_ = (bool)(node._1_1_ & 1);
          }
        }
        else {
          if ((local_119 & 1U) != 0) {
            PopClipRect();
          }
          (pIVar3->DC).CursorPos = IStack_d0;
        }
      }
      else {
        PushItemFlag(0x18,true);
        ImRect::ImRect((ImRect *)&backup_main_cursor_pos);
        ItemAdd((ImRect *)&backup_main_cursor_pos,tab_id,(ImRect *)0x0);
        PopItemFlag();
        if (bVar11) {
          tab_bar_local._7_1_ = false;
        }
      }
    }
    else {
      PushItemFlag(0x18,true);
      ImRect::ImRect((ImRect *)&size);
      ItemAdd((ImRect *)&size,tab_id,(ImRect *)0x0);
      PopItemFlag();
      tab_bar_local._7_1_ = false;
    }
  }
  else {
    tab_bar_local._7_1_ = false;
  }
  return tab_bar_local._7_1_;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags, ImGuiWindow* docked_window)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label, docked_window);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;
    tab->Window = docked_window;

    // Append name with zero-terminator
    // (regular tabs are permitted in a DockNode tab bar, but window tabs not permitted in a non-DockNode tab bar)
    if (tab->Window != NULL)
    {
        IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_DockNode);
        tab->NameOffset = -1;
    }
    else
    {
        IM_ASSERT(tab->Window == NULL);
        tab->NameOffset = (ImS16)tab_bar->TabsNames.size();
        tab_bar->TabsNames.append(label, label + strlen(label) + 1); // Append name _with_ the zero-terminator.
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing && docked_window == NULL)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive && !g.DragDropPayload.IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW))
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Transfer active id window so the active id is not owned by the dock host (as StartMouseMovingWindow()
    // will only do it on the drag). This allows FocusWindow() to be more conservative in how it clears active id.
    if (held && docked_window && g.ActiveId == id && g.ActiveIdIsJustActivated)
        g.ActiveIdWindow = docked_window;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop a single floating window node moves it
    ImGuiDockNode* node = docked_window ? docked_window->DockNode : NULL;
    const bool single_floating_window_node = node && node->IsFloatingNode() && (node->Windows.Size == 1);
    if (held && single_floating_window_node && IsMouseDragging(0, 0.0f))
    {
        // Move
        StartMouseMovingWindow(docked_window);
    }
    else if (held && !tab_appearing && IsMouseDragging(0))
    {
        // Drag and drop: re-order tabs
        float drag_distance_from_edge_x = 0.0f;
        if (!g.DragDropActive && ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (docked_window != NULL)))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                drag_distance_from_edge_x = bb.Min.x - g.IO.MousePos.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                drag_distance_from_edge_x = g.IO.MousePos.x - bb.Max.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, +1);
            }
        }

        // Extract a Dockable window out of it's tab bar
        if (docked_window != NULL && !(docked_window->Flags & ImGuiWindowFlags_NoMove))
        {
            // We use a variable threshold to distinguish dragging tabs within a tab bar and extracting them out of the tab bar
            bool undocking_tab = (g.DragDropActive && g.DragDropPayload.SourceId == id);

            if (!undocking_tab) //&& (!g.IO.ConfigDockingWithShift || g.IO.KeyShift)
            {
                float threshold_base = g.FontSize;
                //float threshold_base = g.IO.ConfigDockingWithShift ? g.FontSize * 0.5f : g.FontSize;
                float threshold_x = (threshold_base * 2.2f);
                float threshold_y = (threshold_base * 1.5f) + ImClamp((ImFabs(g.IO.MouseDragMaxDistanceAbs[0].x) - threshold_base * 2.0f) * 0.20f, 0.0f, threshold_base * 4.0f);
                //GetForegroundDrawList()->AddRect(ImVec2(bb.Min.x - threshold_x, bb.Min.y - threshold_y), ImVec2(bb.Max.x + threshold_x, bb.Max.y + threshold_y), IM_COL32_WHITE); // [DEBUG]

                float distance_from_edge_y = ImMax(bb.Min.y - g.IO.MousePos.y, g.IO.MousePos.y - bb.Max.y);
                if (distance_from_edge_y >= threshold_y)
                    undocking_tab = true;
                else if (drag_distance_from_edge_x > threshold_x)
                    if ((tab_bar->ReorderRequestDir < 0 && tab_bar->GetTabOrder(tab) == 0) || (tab_bar->ReorderRequestDir > 0 && tab_bar->GetTabOrder(tab) == tab_bar->Tabs.Size - 1))
                        undocking_tab = true;
            }

            if (undocking_tab)
            {
                // Undock
                DockContextQueueUndockWindow(&g, docked_window);
                g.MovingWindow = docked_window;
                SetActiveID(g.MovingWindow->MoveId, g.MovingWindow);
                g.ActiveIdClickOffset -= g.MovingWindow->Pos - bb.Min;
                g.ActiveIdNoClearOnFocusLoss = true;
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}